

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::CtxSwitchARegister::sim_write
          (CtxSwitchARegister *this,pgraph_state *state,uint32_t val)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  byte bVar3;
  
  uVar1 = (this->super_SimpleMmioRegister).super_MmioRegister.super_Register.mask;
  iVar2 = (*(this->super_SimpleMmioRegister).super_MmioRegister.super_Register._vptr_Register[3])();
  *(uint *)CONCAT44(extraout_var,iVar2) = uVar1 & val;
  uVar1 = (state->chipset).card_type;
  if ((int)uVar1 < 3) {
    bVar3 = 0;
  }
  else if (uVar1 < 0x10) {
    bVar3 = (*(byte *)((long)&state->debug_c + 3) & 0x10) >> 4;
  }
  else {
    bVar3 = (*(byte *)((long)&state->debug_d + 2) & 8) >> 3;
  }
  bVar3 = (int)val < 0 & bVar3;
  state->debug_b = state->debug_b & 0xfffffffe | (uint)bVar3;
  if (bVar3 == 1) {
    pgraph_volatile_reset(state);
    return;
  }
  return;
}

Assistant:

void sim_write(struct pgraph_state *state, uint32_t val) override {
		ref(state) = val & mask;
		bool vre;
		if (state->chipset.card_type < 3) {
			vre = false;
		} else if (state->chipset.card_type < 0x10) {
			vre = extr(state->debug_c, 28, 1);
		} else {
			vre = extr(state->debug_d, 19, 1);
		}
		bool vr = extr(val, 31, 1) && vre;
		insrt(state->debug_b, 0, 1, vr);
		if (vr)
			pgraph_volatile_reset(state);
	}